

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSAnnotation.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XSAnnotation::XSAnnotation(XSAnnotation *this,XMLCh *content,MemoryManager *manager)

{
  short *psVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t __n;
  XMLCh *__dest;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XSerializable_00413830;
  __dest = (XMLCh *)0x0;
  XSObject::XSObject(&this->super_XSObject,ANNOTATION,(XSModel *)0x0,manager);
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XSAnnotation_00413780;
  (this->super_XSObject)._vptr_XSObject = (_func_int **)&PTR__XSAnnotation_004137b8;
  if (content != (XMLCh *)0x0) {
    __n = 0;
    do {
      psVar1 = (short *)((long)content + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,__n);
    __dest = (XMLCh *)CONCAT44(extraout_var,iVar2);
    memcpy(__dest,content,__n);
  }
  this->fContents = __dest;
  this->fNext = (XSAnnotation *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fLine = 0;
  this->fCol = 0;
  return;
}

Assistant:

XSAnnotation::XSAnnotation(const XMLCh*          const content,
                                 MemoryManager * const manager)
:XSObject(XSConstants::ANNOTATION, 0, manager)
,fContents(XMLString::replicate(content, manager))
,fNext(0)
,fSystemId(0)
,fLine(0)
,fCol(0)
{
}